

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O3

void __thiscall
kratos::VarPackedStruct::VarPackedStruct
          (VarPackedStruct *this,Generator *m,string *name,
          shared_ptr<kratos::PackedStruct> *packed_struct_,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *size)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  uint32_t uVar2;
  
  Var::Var(&this->super_Var,m,name,1,size,false);
  (this->super_Var).super_IRNode._vptr_IRNode = (_func_int **)&PTR_accept_002ae018;
  (this->super_PackedInterface)._vptr_PackedInterface =
       (_func_int **)&PTR_member_names_abi_cxx11__002ae198;
  (this->struct_).super___shared_ptr<kratos::PackedStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (packed_struct_->super___shared_ptr<kratos::PackedStruct,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
  ;
  (this->struct_).super___shared_ptr<kratos::PackedStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var1 = (packed_struct_->super___shared_ptr<kratos::PackedStruct,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  (packed_struct_->super___shared_ptr<kratos::PackedStruct,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->struct_).super___shared_ptr<kratos::PackedStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var1;
  (packed_struct_->super___shared_ptr<kratos::PackedStruct,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)0x0;
  uVar2 = PackedStruct::bitwidth
                    ((this->struct_).
                     super___shared_ptr<kratos::PackedStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  (this->super_Var).var_width_ = uVar2;
  return;
}

Assistant:

VarPackedStruct::VarPackedStruct(Generator *m, const std::string &name,
                                 std::shared_ptr<PackedStruct> packed_struct_,
                                 const std::vector<uint32_t> &size)
    : Var(m, name, 1, size, false), struct_(std::move(packed_struct_)) {
    compute_width();
}